

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void Js::VariableWalkerBase::GetReturnedValueResolvedObject
               (ReturnedValue *returnValue,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  charcount_t displayNameBufferLength;
  JavascriptString *in_RAX;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  undefined4 *puVar5;
  LPCWSTR string;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LocalObjectAddressForRegSlot *this_00;
  FunctionBody *pFVar6;
  undefined4 extraout_var_01;
  char16 *pcVar7;
  IDiagObjectModelDisplay *pIVar8;
  undefined8 uVar9;
  JavascriptString *local_38;
  JavascriptString *displayName;
  
  local_38 = in_RAX;
  this = &GetArenaFromContext(pResolvedObject->scriptContext)->
          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_008bc837;
    *puVar5 = 0;
  }
  string = (LPCWSTR)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    AllocInternal(this,0x1fe);
  if (string == (LPCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) goto LAB_008bc837;
    *puVar5 = 0;
  }
  if (returnValue->isValueOfReturnStatement == true) {
    swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[Return value]");
    iVar4 = (*frame->_vptr_DiagStackFrame[5])(frame,0,0);
    pResolvedObject->obj = (Var)CONCAT44(extraout_var,iVar4);
    iVar4 = (*frame->_vptr_DiagStackFrame[0xe])(frame);
    this_00 = (LocalObjectAddressForRegSlot *)
              new<Memory::ArenaAllocator>
                        (0x20,(ArenaAllocator *)CONCAT44(extraout_var_00,iVar4),0x366bee);
    LocalObjectAddressForRegSlot::LocalObjectAddressForRegSlot(this_00,frame,0,pResolvedObject->obj)
    ;
    uVar9 = 0x8000020;
  }
  else {
    BVar3 = JavascriptFunction::IsScriptFunction((returnValue->calledFunction).ptr);
    if (BVar3 == 0) {
      EnterPinnedScope(&local_38);
      local_38 = JavascriptFunction::GetDisplayName((returnValue->calledFunction).ptr);
      pcVar7 = JavascriptString::GetString(local_38);
      displayNameBufferLength = JavascriptString::GetLength(local_38);
      pcVar7 = ParseFunctionName(pcVar7,displayNameBufferLength,pResolvedObject->scriptContext);
      swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[%s returned]",pcVar7);
      LeavePinnedScope();
    }
    else {
      pFVar6 = JavascriptFunction::GetFunctionBody((returnValue->calledFunction).ptr);
      iVar4 = (*(pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar6);
      swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[%s returned]",
                 CONCAT44(extraout_var_01,iVar4));
    }
    pResolvedObject->obj = (returnValue->returnedValue).ptr;
    uVar9 = 0x8000820;
    this_00 = (LocalObjectAddressForRegSlot *)0x0;
  }
  pResolvedObject->address = &this_00->super_IDiagObjectAddress;
  if (pResolvedObject->obj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf2,"(pResolvedObject->obj != nullptr)",
                                "pResolvedObject->obj != nullptr");
    if (!bVar2) {
LAB_008bc837:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pResolvedObject->name = string;
  pResolvedObject->typeId = TypeIds_Object;
  pIVar8 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar8;
  (*pIVar8->_vptr_IDiagObjectModelDisplay[6])(pIVar8,uVar9);
  return;
}

Assistant:

void VariableWalkerBase::GetReturnedValueResolvedObject(ReturnedValue * returnValue, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_VALUE_IS_RETURN_VALUE | DBGPROP_ATTRIB_VALUE_IS_FAKE;
        WCHAR * finalName = AnewArray(GetArenaFromContext(pResolvedObject->scriptContext), WCHAR, RETURN_VALUE_MAX_NAME);
        if (returnValue->isValueOfReturnStatement)
        {
            swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[Return value]"));
            pResolvedObject->obj = frame->GetRegValue(Js::FunctionBody::ReturnValueRegSlot);
            pResolvedObject->address = Anew(frame->GetArena(), LocalObjectAddressForRegSlot, frame, Js::FunctionBody::ReturnValueRegSlot, pResolvedObject->obj);
        }
        else
        {
            if (returnValue->calledFunction->IsScriptFunction())
            {
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), returnValue->calledFunction->GetFunctionBody()->GetDisplayName());
            }
            else
            {
                ENTER_PINNED_SCOPE(JavascriptString, displayName);
                displayName = returnValue->calledFunction->GetDisplayName();

                const char16 *builtInName = ParseFunctionName(displayName->GetString(), displayName->GetLength(), pResolvedObject->scriptContext);
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), builtInName);

                LEAVE_PINNED_SCOPE();
            }
            pResolvedObject->obj = returnValue->returnedValue;
            defaultAttributes |= DBGPROP_ATTRIB_VALUE_READONLY;
            pResolvedObject->address = nullptr;
        }
        Assert(pResolvedObject->obj != nullptr);

        pResolvedObject->name = finalName;
        pResolvedObject->typeId = TypeIds_Object;

        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);
    }